

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O0

void __thiscall Js::JavascriptMap::SetOnComplexVarMap(JavascriptMap *this,Var key,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar4;
  Recycler *recycler;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *local_70;
  MapDataNode *newNode;
  WriteBarrierPtr<void> local_60;
  undefined1 local_58 [8];
  MapDataKeyValuePair pair;
  WriteBarrierPtr<void> local_40;
  KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> local_38;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *local_28;
  MapDataNode *node;
  Var value_local;
  Var key_local;
  JavascriptMap *this_local;
  
  node = (MapDataNode *)value;
  value_local = key;
  key_local = this;
  if (this->kind != ComplexVarMap) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x232,"(this->kind == MapKind::ComplexVarMap)",
                                "this->kind == MapKind::ComplexVarMap");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_28 = (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
              *)0x0;
  pBVar4 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                         *)&(this->u).simpleVarMap);
  bVar2 = JsUtil::
          BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)pBVar4,&value_local,&local_28);
  if (bVar2) {
    Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&local_40,value_local);
    Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&pair.value,node);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::
    KeyValuePair(&local_38,&local_40,&pair.value);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::operator=
              (&local_28->data,&local_38);
  }
  else {
    Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&local_60,value_local);
    Memory::WriteBarrierPtr<void>::WriteBarrierPtr((WriteBarrierPtr<void> *)&newNode,node);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::
    KeyValuePair((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                 local_58,&local_60,(WriteBarrierPtr<void> *)&newNode);
    recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
    local_70 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
               ::Append(&this->list,
                        (KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>
                         *)local_58,recycler);
    pBVar4 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                           *)&(this->u).simpleVarMap);
    JsUtil::
    BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(pBVar4,&value_local,&local_70);
  }
  return;
}

Assistant:

void
JavascriptMap::SetOnComplexVarMap(Var key, Var value)
{
    Assert(this->kind == MapKind::ComplexVarMap);

    MapDataNode* node = nullptr;
    if (this->u.complexVarMap->TryGetValue(key, &node))
    {
        node->data = MapDataKeyValuePair(key, value);
        return;
    }

    MapDataKeyValuePair pair(key, value);
    MapDataNode* newNode = this->list.Append(pair, this->GetRecycler());
    this->u.complexVarMap->Add(key, newNode);
}